

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O2

void __thiscall runtime::VirtualMachine::print(VirtualMachine *this)

{
  element_type *peVar1;
  Function *pFVar2;
  element_type *peVar3;
  pointer pbVar4;
  ostream *poVar5;
  reference pvVar6;
  const_reference pvVar7;
  const_reference fn;
  const_reference pvVar8;
  size_t i;
  ulong uVar9;
  pointer pbVar10;
  shared_ptr<runtime::StackFrame> *psVar11;
  size_t i_1;
  Variable VVar12;
  Variable var;
  Variable var_00;
  ByteCode bc;
  string local_58;
  vector<runtime::Variable,_std::allocator<runtime::Variable>_> *local_38;
  
  std::operator<<(this->out,"Stack Frames:\n");
  psVar11 = &this->stackFrame;
  while( true ) {
    peVar1 = (psVar11->super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (peVar1 == (element_type *)0x0) break;
    poVar5 = std::operator<<(this->out,"| Stack Frame: ");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0);
    std::operator<<(poVar5,'\n');
    poVar5 = std::operator<<(this->out,"| | Program Counter: ");
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::operator<<(poVar5,'\n');
    std::operator<<(this->out,"| | Locals:\n");
    local_38 = &peVar1->locals;
    for (uVar9 = 0;
        uVar9 < (ulong)((long)(peVar1->locals).
                              super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(peVar1->locals).
                              super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 4); uVar9 = uVar9 + 1) {
      poVar5 = std::operator<<(this->out,"| |   |");
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      poVar5 = std::operator<<(poVar5,"| ");
      pvVar6 = std::vector<runtime::Variable,_std::allocator<runtime::Variable>_>::at
                         (local_38,uVar9);
      var._4_4_ = 0;
      var.type = pvVar6->type;
      var.field_1.integerValue = (pvVar6->field_1).integerValue;
      variableToString_abi_cxx11_(&local_58,this,var,false);
      poVar5 = std::operator<<(poVar5,(string *)&local_58);
      std::operator<<(poVar5,'\n');
      std::__cxx11::string::~string((string *)&local_58);
    }
    std::operator<<(this->out,"| | Captures:\n");
    for (uVar9 = 0;
        uVar9 < (ulong)((long)(peVar1->function->captures).
                              super__Vector_base<runtime::ClosureContext,_std::allocator<runtime::ClosureContext>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(peVar1->function->captures).
                              super__Vector_base<runtime::ClosureContext,_std::allocator<runtime::ClosureContext>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 4); uVar9 = uVar9 + 1) {
      poVar5 = std::operator<<(this->out,"| |   |");
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      poVar5 = std::operator<<(poVar5,"| ");
      VVar12 = loadClosureValue(this,peVar1->function,uVar9);
      var_00._4_4_ = 0;
      var_00.type = VVar12.type;
      var_00.field_1.integerValue = VVar12.field_1.integerValue;
      variableToString_abi_cxx11_(&local_58,this,var_00,false);
      poVar5 = std::operator<<(poVar5,(string *)&local_58);
      std::operator<<(poVar5,'\n');
      std::__cxx11::string::~string((string *)&local_58);
    }
    std::operator<<(this->out,"| | Op Stack:\n");
    local_38 = &peVar1->opStack;
    for (uVar9 = 0;
        uVar9 < (ulong)((long)(peVar1->opStack).
                              super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(peVar1->opStack).
                              super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 4); uVar9 = uVar9 + 1) {
      poVar5 = std::operator<<(this->out,"| |   |");
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      poVar5 = std::operator<<(poVar5,"| ");
      pvVar6 = std::vector<runtime::Variable,_std::allocator<runtime::Variable>_>::at
                         (local_38,uVar9);
      VVar12._4_4_ = 0;
      VVar12.type = pvVar6->type;
      VVar12.field_1.integerValue = (pvVar6->field_1).integerValue;
      variableToString_abi_cxx11_(&local_58,this,VVar12,false);
      poVar5 = std::operator<<(poVar5,(string *)&local_58);
      std::operator<<(poVar5,'\n');
      std::__cxx11::string::~string((string *)&local_58);
    }
    std::operator<<(this->out,"| | Byte Code:\n");
    for (uVar9 = 0; pFVar2 = peVar1->function->fn,
        uVar9 < (ulong)((long)(pFVar2->byteCode).
                              super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pFVar2->byteCode).
                              super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 4); uVar9 = uVar9 + 1) {
      poVar5 = std::operator<<(this->out,"| |   |");
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      poVar5 = std::operator<<(poVar5,"| ");
      pvVar7 = std::vector<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>::at
                         (&peVar1->function->fn->byteCode,uVar9);
      bc._4_4_ = 0;
      bc.instruction = pvVar7->instruction;
      bc.parameter = pvVar7->parameter;
      byteCodeToString_abi_cxx11_(&local_58,this,bc,false);
      poVar5 = std::operator<<(poVar5,(string *)&local_58);
      std::operator<<(poVar5,'\n');
      std::__cxx11::string::~string((string *)&local_58);
    }
    std::operator<<(this->out,"| \\------------------\n");
    psVar11 = &peVar1->outer;
  }
  std::operator<<(this->out,"\\------------------\n");
  std::operator<<(this->out,"Entrypoint:\n");
  printFunction(this,&((this->file).
                       super___shared_ptr<const_bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->entrypoint);
  std::operator<<(this->out,"\\------------------\n");
  std::operator<<(this->out,"Functions:\n");
  for (uVar9 = 0;
      peVar3 = (this->file).
               super___shared_ptr<const_bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
      uVar9 < (ulong)((long)(peVar3->functions).
                            super__Vector_base<bytecode::Function,_std::allocator<bytecode::Function>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(peVar3->functions).
                            super__Vector_base<bytecode::Function,_std::allocator<bytecode::Function>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 6); uVar9 = uVar9 + 1) {
    poVar5 = std::operator<<(this->out,"| Function: ");
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::operator<<(poVar5,'\n');
    fn = std::vector<bytecode::Function,_std::allocator<bytecode::Function>_>::at
                   (&((this->file).
                      super___shared_ptr<const_bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->functions,uVar9);
    printFunction(this,fn);
  }
  std::operator<<(this->out,"\\------------------\n");
  std::operator<<(this->out,"Object Constructors:\n");
  uVar9 = 0;
  while( true ) {
    peVar3 = (this->file).
             super___shared_ptr<const_bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((ulong)(((long)(peVar3->objects).
                       super__Vector_base<bytecode::ObjectConstructor,_std::allocator<bytecode::ObjectConstructor>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)(peVar3->objects).
                      super__Vector_base<bytecode::ObjectConstructor,_std::allocator<bytecode::ObjectConstructor>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x18) <= uVar9) break;
    poVar5 = std::operator<<(this->out,"| |");
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::operator<<(poVar5,"| ");
    pvVar8 = std::vector<bytecode::ObjectConstructor,_std::allocator<bytecode::ObjectConstructor>_>
             ::at(&((this->file).
                    super___shared_ptr<const_bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->objects,uVar9);
    pbVar4 = (pvVar8->keys).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar10 = (pvVar8->keys).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pbVar10 != pbVar4;
        pbVar10 = pbVar10 + 1) {
      poVar5 = std::operator<<(this->out,(string *)pbVar10);
      std::operator<<(poVar5,", ");
    }
    std::operator<<(this->out,'\n');
    uVar9 = uVar9 + 1;
  }
  std::operator<<(this->out,"\\------------------\n");
  std::operator<<(this->out,"Integer Constants:\n");
  printConstantArray<long>
            (this->out,
             &((this->file).
               super___shared_ptr<const_bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->intConstants);
  std::operator<<(this->out,"\\------------------\n");
  std::operator<<(this->out,"Float Constants:\n");
  printConstantArray<double>
            (this->out,
             &((this->file).
               super___shared_ptr<const_bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->floatConstants);
  std::operator<<(this->out,"\\------------------\n");
  std::operator<<(this->out,"String Constants:\n");
  printConstantArray<std::__cxx11::string>
            (this->out,
             &((this->file).
               super___shared_ptr<const_bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->stringConstants);
  std::operator<<(this->out,"\\------------------\n");
  std::endl<char,std::char_traits<char>>(this->out);
  return;
}

Assistant:

void runtime::VirtualMachine::print() {
  this->out << "Stack Frames:\n";

  StackFrame* stackFrame = this->stackFrame.get();

  int frameDepth = 0;

  while (stackFrame != nullptr) {
    this->out << "| Stack Frame: " << frameDepth << '\n';
    this->out << "| | Program Counter: " << stackFrame->programCounter << '\n';
    this->out << "| | Locals:\n";
    for (std::size_t i = 0; i < stackFrame->locals.size(); i++) {
      this->out << "| |   |" << i << "| " << this->variableToString(stackFrame->locals.at(i), false) << '\n';
    }
    this->out << "| | Captures:\n";
    for (std::size_t i = 0; i < stackFrame->function->captures.size(); i++) {
      this->out << "| |   |" << i << "| " << this->variableToString(this->loadClosureValue(stackFrame->function, i), false) << '\n';
    }
    this->out << "| | Op Stack:\n";
    for (std::size_t i = 0; i < stackFrame->opStack.size(); i++) {
      this->out << "| |   |" << i << "| " << this->variableToString(stackFrame->opStack.at(i), false) << '\n';
    }
    this->out << "| | Byte Code:\n";
    for (std::size_t i = 0; i < stackFrame->function->fn->byteCode.size(); i++) {
      this->out << "| |   |" << i << "| " << this->byteCodeToString(stackFrame->function->fn->byteCode.at(i), false) << '\n';
    }
    this->out << "| \\------------------\n";

    stackFrame = stackFrame->outer.get();
  }
  this->out << "\\------------------\n";

  this->out << "Entrypoint:\n";
  this->printFunction(&this->file->entrypoint);
  this->out << "\\------------------\n";

  this->out << "Functions:\n";
  for (std::size_t i = 0; i < this->file->functions.size(); i++) {
    this->out << "| Function: " << i << '\n';
    this->printFunction(&this->file->functions.at(i));
  }
  this->out << "\\------------------\n";

  this->out << "Object Constructors:\n";
  for (std::size_t i = 0; i < this->file->objects.size(); i++) {
    this->out << "| |" << i << "| ";
    const auto& obj = this->file->objects.at(i);
    for (const auto& key : obj.keys) {
      this->out << key << ", ";
    }
    this->out << '\n';
  }
  this->out << "\\------------------\n";

  this->out << "Integer Constants:\n";
  printConstantArray<std::int64_t>(this->out, this->file->intConstants);
  this->out << "\\------------------\n";

  this->out << "Float Constants:\n";
  printConstantArray<double>(this->out, this->file->floatConstants);
  this->out << "\\------------------\n";

  this->out << "String Constants:\n";
  printConstantArray<std::string>(this->out, this->file->stringConstants);
  this->out << "\\------------------\n";

  this->out << std::endl;
}